

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

lzma_ret lzma_lz_encoder_init
                   (lzma_next_coder_conflict13 *next,lzma_allocator *allocator,
                   lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  _Bool _Var1;
  lzma_coder_conflict14 *plVar2;
  undefined1 local_70 [4];
  lzma_ret ret_;
  lzma_lz_options_conflict lz_options;
  _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr *lz_init_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict13 *next_local;
  
  lz_options._56_8_ = lz_init;
  if (next->coder == (lzma_coder_conflict14 *)0x0) {
    plVar2 = (lzma_coder_conflict14 *)lzma_alloc(0xd8,allocator);
    next->coder = plVar2;
    if (next->coder == (lzma_coder_conflict14 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = lz_encode;
    next->end = lz_encoder_end;
    next->update = lz_encoder_update;
    (next->coder->lz).coder = (lzma_coder_conflict14 *)0x0;
    (next->coder->lz).code =
         (_func_lzma_ret_lzma_coder_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t_conflict1 *)0x0;
    (next->coder->lz).end = (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict12 *)0x0;
    (next->coder->mf).buffer = (uint8_t *)0x0;
    (next->coder->mf).hash = (uint32_t *)0x0;
    (next->coder->mf).hash_size_sum = 0;
    (next->coder->mf).sons_count = 0;
    memcpy(&next->coder->next,&LZMA_NEXT_CODER_INIT,0x40);
  }
  next_local._4_4_ = (*(code *)lz_options._56_8_)(next->coder,allocator,filters->options,local_70);
  if (next_local._4_4_ == LZMA_OK) {
    _Var1 = lz_encoder_prepare(&next->coder->mf,allocator,(lzma_lz_options_conflict *)local_70);
    if (_Var1) {
      next_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
    else {
      _Var1 = lz_encoder_init(&next->coder->mf,allocator,(lzma_lz_options_conflict *)local_70);
      if (_Var1) {
        next_local._4_4_ = LZMA_MEM_ERROR;
      }
      else {
        next_local._4_4_ =
             lzma_next_filter_init((lzma_next_coder *)&next->coder->next,allocator,filters + 1);
      }
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lz_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_encoder *lz,
			lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
	lzma_lz_options lz_options;

#ifdef HAVE_SMALL
	// We need that the CRC32 table has been initialized.
	lzma_crc32_init();
#endif

	// Allocate and initialize the base data structure.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &lz_encode;
		next->end = &lz_encoder_end;
		next->update = &lz_encoder_update;

		next->coder->lz.coder = NULL;
		next->coder->lz.code = NULL;
		next->coder->lz.end = NULL;

		next->coder->mf.buffer = NULL;
		next->coder->mf.hash = NULL;
		next->coder->mf.hash_size_sum = 0;
		next->coder->mf.sons_count = 0;

		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Initialize the LZ-based encoder.
	return_if_error(lz_init(&next->coder->lz, allocator,
			filters[0].options, &lz_options));

	// Setup the size information into next->coder->mf and deallocate
	// old buffers if they have wrong size.
	if (lz_encoder_prepare(&next->coder->mf, allocator, &lz_options))
		return LZMA_OPTIONS_ERROR;

	// Allocate new buffers if needed, and do the rest of
	// the initialization.
	if (lz_encoder_init(&next->coder->mf, allocator, &lz_options))
		return LZMA_MEM_ERROR;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&next->coder->next, allocator,
			filters + 1);
}